

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_NodeCollect_rec(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Int_t *vSupp)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vSupp_local;
  Gia_Obj_t *pNode_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pNode);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pNode);
    iVar1 = Gia_ObjRefNum(p,pNode);
    if ((iVar1 == 0) && (iVar1 = Gia_ObjIsCi(pNode), iVar1 == 0)) {
      iVar1 = Gia_ObjIsAnd(pNode);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUtil.c"
                      ,0x4c1,"void Gia_NodeCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pGVar2 = Gia_ObjFanin0(pNode);
      Gia_NodeCollect_rec(p,pGVar2,vSupp);
      pGVar2 = Gia_ObjFanin1(pNode);
      Gia_NodeCollect_rec(p,pGVar2,vSupp);
    }
    else {
      iVar1 = Gia_ObjId(p,pNode);
      Vec_IntPush(vSupp,iVar1);
    }
  }
  return;
}

Assistant:

void Gia_NodeCollect_rec( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Int_t * vSupp )
{
    if ( Gia_ObjIsTravIdCurrent(p, pNode) )
        return;
    Gia_ObjSetTravIdCurrent(p, pNode);
    if ( Gia_ObjRefNum(p, pNode) || Gia_ObjIsCi(pNode) )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pNode) );
        return;
    }
    assert( Gia_ObjIsAnd(pNode) );
    Gia_NodeCollect_rec( p, Gia_ObjFanin0(pNode), vSupp );
    Gia_NodeCollect_rec( p, Gia_ObjFanin1(pNode), vSupp );
}